

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::~PosixRandomAccessFile(PosixRandomAccessFile *this)

{
  pointer pcVar1;
  
  (this->super_RandomAccessFile)._vptr_RandomAccessFile =
       (_func_int **)&PTR__PosixRandomAccessFile_00133ca8;
  close(this->fd_);
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
  }
  RandomAccessFile::~RandomAccessFile(&this->super_RandomAccessFile);
  return;
}

Assistant:

virtual Status Read(uint64_t offset, size_t n, Slice *result,
                                char *scratch) const {
                Status s;
                ssize_t r = pread(fd_, scratch, n, static_cast<off_t>(offset));
                *result = Slice(scratch, (r < 0) ? 0 : r);
                if (r < 0) {
                    // An error: return a non-ok status
                    s = IOError(filename_, errno);
                }
                return s;
            }